

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::BeginGroup(void)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ImGuiWindow_conflict *pIVar5;
  ImGuiGroupData *pIVar6;
  ImGuiContext_conflict1 *pIVar7;
  ImGuiGroupData *__dest;
  uint uVar8;
  ImGuiContext_conflict1 *ctx;
  float fVar9;
  
  pIVar7 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  iVar3 = (GImGui->GroupStack).Size;
  uVar2 = iVar3 + 1;
  iVar4 = (GImGui->GroupStack).Capacity;
  if (iVar4 <= iVar3) {
    if (iVar4 == 0) {
      uVar8 = 8;
    }
    else {
      uVar8 = iVar4 / 2 + iVar4;
    }
    if ((int)uVar8 <= (int)uVar2) {
      uVar8 = uVar2;
    }
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiGroupData *)
             (*GImAllocatorAllocFunc)((long)(int)uVar8 * 0x30,GImAllocatorUserData);
    pIVar6 = (pIVar7->GroupStack).Data;
    if (pIVar6 != (ImGuiGroupData *)0x0) {
      memcpy(__dest,pIVar6,(long)(pIVar7->GroupStack).Size * 0x30);
      pIVar6 = (pIVar7->GroupStack).Data;
      if ((pIVar6 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext_conflict1 *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar6,GImAllocatorUserData);
    }
    (pIVar7->GroupStack).Data = __dest;
    (pIVar7->GroupStack).Capacity = uVar8;
  }
  (pIVar7->GroupStack).Size = uVar2;
  if (-1 < iVar3) {
    pIVar6 = (pIVar7->GroupStack).Data;
    pIVar6[(ulong)uVar2 - 1].WindowID = pIVar5->ID;
    pIVar6[(ulong)uVar2 - 1].BackupCursorPos = (pIVar5->DC).CursorPos;
    pIVar6[(ulong)uVar2 - 1].BackupCursorMaxPos = (pIVar5->DC).CursorMaxPos;
    pIVar6[(ulong)uVar2 - 1].BackupIndent.x = (pIVar5->DC).Indent.x;
    pIVar6[(ulong)uVar2 - 1].BackupGroupOffset.x = (pIVar5->DC).GroupOffset.x;
    pIVar6[(ulong)uVar2 - 1].BackupCurrLineSize = (pIVar5->DC).CurrLineSize;
    pIVar6[(ulong)uVar2 - 1].BackupCurrLineTextBaseOffset = (pIVar5->DC).CurrLineTextBaseOffset;
    pIVar6[(ulong)uVar2 - 1].BackupActiveIdIsAlive = pIVar7->ActiveIdIsAlive;
    pIVar6[(ulong)uVar2 - 1].BackupHoveredIdIsAlive = pIVar7->HoveredId != 0;
    pIVar6[(ulong)uVar2 - 1].BackupActiveIdPreviousFrameIsAlive =
         pIVar7->ActiveIdPreviousFrameIsAlive;
    pIVar6[(ulong)uVar2 - 1].EmitItem = true;
    fVar9 = ((pIVar5->DC).CursorPos.x - (pIVar5->Pos).x) - (pIVar5->DC).ColumnsOffset.x;
    (pIVar5->DC).GroupOffset.x = fVar9;
    (pIVar5->DC).Indent.x = fVar9;
    (pIVar5->DC).CursorMaxPos = (pIVar5->DC).CursorPos;
    (pIVar5->DC).CurrLineSize.x = 0.0;
    (pIVar5->DC).CurrLineSize.y = 0.0;
    if (pIVar7->LogEnabled == true) {
      pIVar7->LogLinePosY = -3.4028235e+38;
    }
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                ,0x70f,"T &ImVector<ImGuiGroupData>::back() [T = ImGuiGroupData]");
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupHoveredIdIsAlive = g.HoveredId != 0;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return
}